

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

exr_result_t generic_unpack_deep_pointers(exr_decode_pipeline_t *decode)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  exr_coding_channel_info_t *peVar4;
  uint16_t uVar5;
  float fVar6;
  int x;
  int iVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  uint8_t *puVar12;
  int iVar13;
  uint8_t *cdata;
  float *pfVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  void *pvVar20;
  int32_t *local_98;
  
  pvVar20 = decode->unpacked_buffer;
  uVar2 = (decode->chunk).width;
  uVar10 = 0;
  if (0 < (int)uVar2) {
    uVar10 = (ulong)uVar2;
  }
  uVar3 = (decode->chunk).height;
  uVar11 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar11 = 0;
  }
  local_98 = decode->sample_count_table;
  uVar8 = 0;
  do {
    if (uVar8 == uVar11) {
      return 0;
    }
    for (lVar16 = 0; lVar16 < decode->channel_count; lVar16 = lVar16 + 1) {
      peVar4 = decode->channels;
      cVar1 = peVar4[lVar16].bytes_per_element;
      if (peVar4[lVar16].field_12.decode_to_ptr == (uint8_t *)0x0) {
        if ((decode->decode_flags & 1) == 0) {
          iVar9 = local_98[(long)(int)uVar2 + -1];
        }
        else {
          iVar9 = 0;
          for (uVar15 = 0; uVar10 != uVar15; uVar15 = uVar15 + 1) {
            iVar9 = iVar9 + local_98[uVar15];
          }
        }
        pvVar20 = (void *)((long)pvVar20 + (long)iVar9 * (long)(int)cVar1);
      }
      else {
        lVar19 = (long)peVar4[lVar16].user_bytes_per_element;
        puVar12 = peVar4[lVar16].field_12.decode_to_ptr +
                  ((ulong)(long)peVar4[lVar16].user_line_stride >> 3) * uVar8 * 8;
        iVar9 = peVar4[lVar16].user_pixel_stride;
        iVar7 = 0;
        for (uVar15 = 0; uVar15 != uVar10; uVar15 = uVar15 + 1) {
          pfVar14 = *(float **)puVar12;
          iVar13 = iVar7;
          iVar17 = local_98[uVar15];
          if ((decode->decode_flags & 1) != 0) {
            iVar13 = 0;
            iVar17 = iVar7;
          }
          iVar7 = iVar17;
          iVar13 = local_98[uVar15] - iVar13;
          if (pfVar14 != (float *)0x0) {
            uVar5 = peVar4[lVar16].data_type;
            if (uVar5 == 0) {
              uVar5 = peVar4[lVar16].user_data_type;
              if (uVar5 == 2) {
                iVar17 = 0;
                if (0 < iVar13) {
                  iVar17 = iVar13;
                }
                for (lVar18 = 0; iVar17 != (int)lVar18; lVar18 = lVar18 + 1) {
                  *pfVar14 = (float)*(uint *)((long)pvVar20 + lVar18 * 4);
                  pfVar14 = (float *)((long)pfVar14 + lVar19);
                }
              }
              else if (uVar5 == 1) {
                iVar17 = 0;
                if (0 < iVar13) {
                  iVar17 = iVar13;
                }
                for (lVar18 = 0; iVar17 != (int)lVar18; lVar18 = lVar18 + 1) {
                  uVar5 = uint_to_half(*(uint32_t *)((long)pvVar20 + lVar18 * 4));
                  *(uint16_t *)pfVar14 = uVar5;
                  pfVar14 = (float *)((long)pfVar14 + lVar19);
                }
              }
              else {
                if (uVar5 != 0) {
                  return 3;
                }
                iVar17 = 0;
                if (0 < iVar13) {
                  iVar17 = iVar13;
                }
                for (lVar18 = 0; iVar17 != (int)lVar18; lVar18 = lVar18 + 1) {
                  *pfVar14 = *(float *)((long)pvVar20 + lVar18 * 4);
                  pfVar14 = (float *)((long)pfVar14 + lVar19);
                }
              }
            }
            else if (uVar5 == 2) {
              uVar5 = peVar4[lVar16].user_data_type;
              if (uVar5 == 2) {
                iVar17 = 0;
                if (0 < iVar13) {
                  iVar17 = iVar13;
                }
                for (lVar18 = 0; iVar17 != (int)lVar18; lVar18 = lVar18 + 1) {
                  *pfVar14 = *(float *)((long)pvVar20 + lVar18 * 4);
                  pfVar14 = (float *)((long)pfVar14 + lVar19);
                }
              }
              else if (uVar5 == 1) {
                iVar17 = 0;
                if (0 < iVar13) {
                  iVar17 = iVar13;
                }
                for (lVar18 = 0; iVar17 != (int)lVar18; lVar18 = lVar18 + 1) {
                  uVar5 = float_to_half(*(float *)((long)pvVar20 + lVar18 * 4));
                  *(uint16_t *)pfVar14 = uVar5;
                  pfVar14 = (float *)((long)pfVar14 + lVar19);
                }
              }
              else {
                if (uVar5 != 0) {
                  return 3;
                }
                iVar17 = 0;
                if (0 < iVar13) {
                  iVar17 = iVar13;
                }
                for (lVar18 = 0; iVar17 != (int)lVar18; lVar18 = lVar18 + 1) {
                  fVar6 = (float)float_to_uint_int(*(uint32_t *)((long)pvVar20 + lVar18 * 4));
                  *pfVar14 = fVar6;
                  pfVar14 = (float *)((long)pfVar14 + lVar19);
                }
              }
            }
            else {
              if (uVar5 != 1) {
                return 3;
              }
              uVar5 = peVar4[lVar16].user_data_type;
              if (uVar5 == 2) {
                iVar17 = 0;
                if (0 < iVar13) {
                  iVar17 = iVar13;
                }
                for (lVar18 = 0; iVar17 != (int)lVar18; lVar18 = lVar18 + 1) {
                  fVar6 = half_to_float(*(uint16_t *)((long)pvVar20 + lVar18 * 2));
                  *pfVar14 = fVar6;
                  pfVar14 = (float *)((long)pfVar14 + lVar19);
                }
              }
              else if (uVar5 == 1) {
                iVar17 = 0;
                if (0 < iVar13) {
                  iVar17 = iVar13;
                }
                for (lVar18 = 0; iVar17 != (int)lVar18; lVar18 = lVar18 + 1) {
                  *(uint16_t *)pfVar14 = *(uint16_t *)((long)pvVar20 + lVar18 * 2);
                  pfVar14 = (float *)((long)pfVar14 + lVar19);
                }
              }
              else {
                if (uVar5 != 0) {
                  return 3;
                }
                iVar17 = 0;
                if (0 < iVar13) {
                  iVar17 = iVar13;
                }
                for (lVar18 = 0; iVar17 != (int)lVar18; lVar18 = lVar18 + 1) {
                  fVar6 = (float)half_to_uint(*(uint16_t *)((long)pvVar20 + lVar18 * 2));
                  *pfVar14 = fVar6;
                  pfVar14 = (float *)((long)pfVar14 + lVar19);
                }
              }
            }
          }
          puVar12 = puVar12 + ((long)iVar9 & 0xfffffffffffffff8);
          pvVar20 = (void *)((long)pvVar20 + (long)(iVar13 * cVar1));
        }
      }
    }
    local_98 = local_98 + (int)uVar2;
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

static exr_result_t
generic_unpack_deep_pointers (exr_decode_pipeline_t* decode)
{
    const uint8_t* srcbuffer  = (const uint8_t*) decode->unpacked_buffer;
    const int32_t* sampbuffer = decode->sample_count_table;
    void**         pdata;
    int            w, h, bpc, ubpc;

    w = decode->chunk.width;
    h = decode->chunk.height;

    for (int y = 0; y < h; ++y)
    {
        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc      = (decode->channels + c);
            int32_t                    prevsamps = 0;
            size_t                     pixstride;
            bpc   = decc->bytes_per_element;
            ubpc  = decc->user_bytes_per_element;
            pdata = (void**) decc->decode_to_ptr;

            if (!pdata)
            {
                prevsamps = 0;
                if ((decode->decode_flags &
                     EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
                {
                    for (int x = 0; x < w; ++x)
                        prevsamps += sampbuffer[x];
                }
                else
                    prevsamps = sampbuffer[w - 1];
                srcbuffer += ((size_t) bpc) * ((size_t) prevsamps);
                continue;
            }

            pdata += ((size_t) y) *
                     (((size_t) decc->user_line_stride) / sizeof (void*));
            pixstride = ((size_t) decc->user_pixel_stride) / sizeof (void*);

            for (int x = 0; x < w; ++x)
            {
                void*   outpix = *pdata;
                int32_t samps  = sampbuffer[x];
                if (0 == (decode->decode_flags &
                          EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
                {
                    int32_t tmp = samps - prevsamps;
                    prevsamps   = samps;
                    samps       = tmp;
                }

                pdata += pixstride;
                if (outpix)
                {
                    uint8_t* cdata = (uint8_t*) outpix;
                    UNPACK_SAMPLES (samps)
                }
                srcbuffer += bpc * samps;
            }
        }
        sampbuffer += w;
    }
    return EXR_ERR_SUCCESS;
}